

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O0

void __thiscall TcpConn::TmpSend(TcpConn *this)

{
  int iVar1;
  BufferChain *local_20;
  BufferChain *bc;
  int32_t ret;
  TcpConn *this_local;
  
  if (((this->super_Buffer).m_writeTail == (BufferChain *)0x0) &&
     (iVar1 = Poller::Mod((this->super_PollObj).m_pPoller,&this->super_PollObj,0x12), iVar1 != 0)) {
    Buffer::Clear(&this->super_Buffer);
  }
  else {
    for (local_20 = (this->super_Buffer).m_head; local_20 != (BufferChain *)0x0;
        local_20 = local_20->nextpkt) {
      Buffer::AddWriteChain(&this->super_Buffer,local_20);
    }
    (this->super_Buffer).m_head = (BufferChain *)0x0;
    (this->super_Buffer).m_end = (BufferChain *)0x0;
  }
  return;
}

Assistant:

void TcpConn::TmpSend()
{
    // 打开epoll写入检测
    if(m_writeTail == nullptr)
    {
        int32_t ret = m_pPoller->Mod(this, EV_WRITE|EV_ET);
        if(ret != 0)
        {
            Clear();
            return;
        }
    }

    for(auto* bc = m_head; bc != nullptr; bc = bc->nextpkt)
    {
        this->AddWriteChain(bc);
    }

    m_head = nullptr;
    m_end = nullptr;
}